

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  ulong uVar1;
  key_type *__k;
  long lVar2;
  bool bVar3;
  uint uVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  char *__s;
  char *pcVar12;
  
  __return_storage_ptr__->length = 0;
  pcVar12 = __return_storage_ptr__->data;
  __return_storage_ptr__->data[0] = '\0';
  __s = __return_storage_ptr__->data + 1;
  memset(__s,0x1b,0x3ff);
  uVar1 = (tex->relativeFileName)._M_string_length;
  if (uVar1 < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)uVar1;
    memcpy(pcVar12,(tex->relativeFileName)._M_dataplus._M_p,uVar1);
    __return_storage_ptr__->data[uVar1] = '\0';
  }
  __k = tex->media;
  if (__k == (key_type *)0x0) {
    return __return_storage_ptr__;
  }
  iVar5 = std::
          _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
          ::find(&(this->textures_converted)._M_t,__k);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header) {
    if (__k->contentLength == 0) {
      bVar11 = false;
      pcVar9 = pcVar12;
      goto LAB_005f95e5;
    }
    uVar7 = ConvertVideo(this,__k);
    pmVar6 = std::
             map<const_Assimp::FBX::Video,_unsigned_int,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
             ::operator[](&this->textures_converted,__k);
    *pmVar6 = uVar7;
  }
  else {
    uVar7 = *(uint *)&iVar5._M_node[6]._M_right;
  }
  bVar11 = true;
  pcVar9 = (char *)(ulong)uVar7;
LAB_005f95e5:
  if ((bVar11) && (this->doc->settings->useLegacyEmbeddedTextureNaming != false)) {
    *pcVar12 = '*';
    uVar7 = 1;
    if ((int)pcVar9 < 0) {
      __s = __return_storage_ptr__->data + 2;
      __return_storage_ptr__->data[1] = '-';
      pcVar9 = (char *)(ulong)(uint)-(int)pcVar9;
      uVar7 = 2;
    }
    iVar10 = 1000000000;
    bVar11 = false;
    do {
      pcVar12 = __s;
      if (0x3fe < uVar7) break;
      uVar1 = (ulong)(uint)((int)(uint)pcVar9 >> 0x1f) << 0x20 | (ulong)pcVar9 & 0xffffffff;
      lVar2 = (long)uVar1 / (long)iVar10;
      uVar8 = (uint)((long)uVar1 % (long)iVar10);
      if (((bVar11) || (iVar10 == 1)) || (uVar4 = (uint)pcVar9, (int)lVar2 != 0)) {
        pcVar12 = __s + 1;
        uVar7 = uVar7 + 1;
        *__s = (char)lVar2 + '0';
        bVar11 = true;
        __s = pcVar12;
        uVar4 = uVar8;
        if (iVar10 != 1) goto LAB_005f9667;
        bVar3 = false;
        iVar10 = 1;
      }
      else {
LAB_005f9667:
        uVar8 = uVar4;
        iVar10 = iVar10 / 10;
        bVar3 = true;
        pcVar12 = __s;
      }
      pcVar9 = (char *)(ulong)uVar8;
      __s = pcVar12;
    } while (bVar3);
    *pcVar12 = '\0';
    __return_storage_ptr__->length = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(*media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[*media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }